

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_reg_t ggml_backend_load_best(char *name,bool silent,char *user_search_path)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  string_type *psVar5;
  long lVar6;
  path *ppVar7;
  long in_RDX;
  byte in_SIL;
  path path;
  path filename_1;
  path *search_path_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range2_1;
  int s;
  ggml_backend_score_t score_fn;
  dl_handle_ptr handle;
  path ext;
  path filename;
  directory_entry *entry;
  directory_iterator __end2;
  directory_iterator __begin2;
  directory_iterator *__range2;
  directory_iterator dir_it;
  path *search_path;
  iterator __end1;
  iterator __begin1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *__range1;
  path best_path;
  int best_score;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  search_paths;
  path file_extension;
  path file_prefix;
  path name_path;
  value_type *in_stack_fffffffffffffb38;
  ggml_backend_registry *in_stack_fffffffffffffb40;
  ggml_backend_reg_t in_stack_fffffffffffffb48;
  ggml_backend_registry *in_stack_fffffffffffffb50;
  path *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  path *in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb78;
  byte in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  undefined6 in_stack_fffffffffffffb88;
  path local_438;
  path local_410;
  string local_3e8 [32];
  string local_3c8 [55];
  undefined1 in_stack_fffffffffffffc6f;
  path *in_stack_fffffffffffffc70;
  ggml_backend_registry *in_stack_fffffffffffffc78;
  __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  local_370;
  undefined1 *local_368;
  string local_360 [36];
  int local_33c;
  code *local_338;
  string local_330 [40];
  string local_308 [72];
  path local_2c0;
  directory_entry *local_298;
  directory_iterator local_260;
  undefined1 *local_250;
  undefined1 local_248 [16];
  string local_238 [32];
  reference local_218;
  path *local_210;
  __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  local_208;
  undefined1 *local_200;
  path local_1f8;
  int local_1cc;
  undefined1 local_150 [64];
  path local_110;
  path local_d8;
  string local_b0 [32];
  string local_90 [72];
  path local_48;
  long local_20;
  byte local_11;
  ggml_backend_reg_t local_8;
  
  local_11 = in_SIL & 1;
  local_20 = in_RDX;
  std::filesystem::__cxx11::u8path<char_const*,std::filesystem::__cxx11::path,char>
            ((char **)in_stack_fffffffffffffb38);
  backend_filename_prefix_abi_cxx11_();
  std::filesystem::__cxx11::path::native(&local_d8);
  std::filesystem::__cxx11::path::native(&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 &in_stack_fffffffffffffb60->_M_pathname);
  std::filesystem::__cxx11::u8path<char[2],std::filesystem::__cxx11::path,char>
            ((char (*) [2])in_stack_fffffffffffffb38);
  std::filesystem::__cxx11::path::native(&local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40);
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffb70,
             (string_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (format)((ulong)in_stack_fffffffffffffb60 >> 0x38));
  std::__cxx11::string::~string(local_90);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_b0);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  backend_filename_extension_abi_cxx11_();
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         0x112936);
  if (local_20 == 0) {
    get_executable_path_abi_cxx11_();
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    push_back((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
    std::filesystem::current_path_abi_cxx11_();
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    push_back((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  }
  else {
    std::filesystem::__cxx11::u8path<char_const*,std::filesystem::__cxx11::path,char>
              ((char **)in_stack_fffffffffffffb38);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    push_back((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  }
  local_1cc = 0;
  std::filesystem::__cxx11::path::path((path *)in_stack_fffffffffffffb40);
  local_200 = local_150;
  local_208._M_current =
       (path *)std::
               vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                        *)in_stack_fffffffffffffb38);
  local_210 = (path *)std::
                      vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                             *)in_stack_fffffffffffffb38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             *)in_stack_fffffffffffffb40,
                            (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             *)in_stack_fffffffffffffb38), bVar1) {
    local_218 = __gnu_cxx::
                __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                ::operator*(&local_208);
    uVar2 = std::filesystem::exists((path *)in_stack_fffffffffffffb40);
    if ((bool)uVar2) {
      std::filesystem::__cxx11::directory_iterator::directory_iterator
                ((directory_iterator *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,none);
      local_250 = local_248;
      std::filesystem::__cxx11::directory_iterator::directory_iterator
                ((directory_iterator *)in_stack_fffffffffffffb40,
                 (directory_iterator *)in_stack_fffffffffffffb38);
      std::filesystem::__cxx11::begin((directory_iterator *)in_stack_fffffffffffffb38);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x112cd6);
      std::filesystem::__cxx11::directory_iterator::directory_iterator
                ((directory_iterator *)in_stack_fffffffffffffb40,
                 (directory_iterator *)in_stack_fffffffffffffb38);
      std::filesystem::__cxx11::end((directory_iterator *)in_stack_fffffffffffffb48);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x112d0d);
      while (bVar1 = std::filesystem::__cxx11::operator!=
                               ((directory_iterator *)in_stack_fffffffffffffb40,
                                (directory_iterator *)in_stack_fffffffffffffb38), bVar1) {
        local_298 = (directory_entry *)
                    std::filesystem::__cxx11::directory_iterator::operator*(&local_260);
        uVar3 = std::filesystem::__cxx11::directory_entry::is_regular_file
                          ((directory_entry *)0x112d67);
        if ((bool)uVar3) {
          std::filesystem::__cxx11::directory_entry::path(local_298);
          std::filesystem::__cxx11::path::filename
                    ((path *)CONCAT17(in_stack_fffffffffffffb7f,
                                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78))
                    );
          std::filesystem::__cxx11::directory_entry::path(local_298);
          std::filesystem::__cxx11::path::extension
                    ((path *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb88)));
          psVar5 = std::filesystem::__cxx11::path::native(&local_2c0);
          std::filesystem::__cxx11::path::operator_cast_to_string(in_stack_fffffffffffffb38);
          lVar6 = std::__cxx11::string::find((string *)psVar5,(ulong)local_308);
          in_stack_fffffffffffffb7e = false;
          if (lVar6 == 0) {
            in_stack_fffffffffffffb7e =
                 std::filesystem::__cxx11::operator==
                           ((path *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          }
          in_stack_fffffffffffffb7f = in_stack_fffffffffffffb7e;
          std::__cxx11::string::~string(local_308);
          if ((in_stack_fffffffffffffb7e & 1) != 0) {
            std::filesystem::__cxx11::directory_entry::operator_cast_to_path_(local_298);
            in_stack_fffffffffffffb70 = (path *)dl_load_library(in_stack_fffffffffffffb60);
            std::unique_ptr<void,dl_handle_deleter>::unique_ptr<dl_handle_deleter,void>
                      ((unique_ptr<void,_dl_handle_deleter> *)in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb38);
            bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<void,_dl_handle_deleter> *)0x112e7c);
            if ((!bVar1) && ((local_11 & 1) == 0)) {
              std::filesystem::__cxx11::directory_entry::path(local_298);
              path_str((path *)CONCAT17(in_stack_fffffffffffffb7f,
                                        CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78
                                                )));
              uVar4 = std::__cxx11::string::c_str();
              ggml_log_internal(4,"%s: failed to load %s\n","ggml_backend_load_best",uVar4);
              std::__cxx11::string::~string(local_330);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<void,_dl_handle_deleter> *)0x112f86);
            if (bVar1) {
              std::unique_ptr<void,_dl_handle_deleter>::get
                        ((unique_ptr<void,_dl_handle_deleter> *)in_stack_fffffffffffffb40);
              local_338 = (code *)dl_get_sym(in_stack_fffffffffffffb40,
                                             (char *)in_stack_fffffffffffffb38);
              if (local_338 == (code *)0x0) {
                if ((local_11 & 1) == 0) {
                  std::filesystem::__cxx11::directory_entry::path(local_298);
                  path_str((path *)CONCAT17(in_stack_fffffffffffffb7f,
                                            CONCAT16(in_stack_fffffffffffffb7e,
                                                     in_stack_fffffffffffffb78)));
                  uVar4 = std::__cxx11::string::c_str();
                  ggml_log_internal(2,"%s: failed to find ggml_backend_score in %s\n",
                                    "ggml_backend_load_best",uVar4);
                  std::__cxx11::string::~string(local_360);
                }
              }
              else {
                in_stack_fffffffffffffb6c = (*local_338)();
                local_33c = in_stack_fffffffffffffb6c;
                if (local_1cc < in_stack_fffffffffffffb6c) {
                  local_1cc = in_stack_fffffffffffffb6c;
                  ppVar7 = std::filesystem::__cxx11::directory_entry::path(local_298);
                  std::filesystem::__cxx11::path::operator=(&local_1f8,ppVar7);
                }
              }
            }
            std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr
                      ((unique_ptr<void,_dl_handle_deleter> *)in_stack_fffffffffffffb40);
          }
          std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
          std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
        }
        std::filesystem::__cxx11::directory_iterator::operator++(&local_260);
      }
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x112d33);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x112d40);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x11314d);
    }
    else {
      path_str((path *)CONCAT17(in_stack_fffffffffffffb7f,
                                CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
      uVar4 = std::__cxx11::string::c_str();
      ggml_log_internal(1,"%s: search path %s does not exist\n","ggml_backend_load_best",uVar4);
      std::__cxx11::string::~string(local_238);
    }
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
    ::operator++(&local_208);
  }
  if (local_1cc == 0) {
    local_368 = local_150;
    local_370._M_current =
         (path *)std::
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)in_stack_fffffffffffffb38);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
        in_stack_fffffffffffffb38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffb40,
                              (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                               *)in_stack_fffffffffffffb38), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::operator*(&local_370);
      backend_filename_prefix_abi_cxx11_();
      ppVar7 = (path *)std::filesystem::__cxx11::path::native(&local_410);
      std::filesystem::__cxx11::path::native(&local_48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     &ppVar7->_M_pathname);
      backend_filename_extension_abi_cxx11_();
      std::filesystem::__cxx11::path::native(&local_438);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb40);
      std::filesystem::__cxx11::path::path
                (in_stack_fffffffffffffb70,
                 (string_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (format)((ulong)ppVar7 >> 0x38));
      std::__cxx11::string::~string(local_3c8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_3e8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
      std::filesystem::__cxx11::operator/
                ((path *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),ppVar7);
      bVar1 = std::filesystem::exists((path *)in_stack_fffffffffffffb40);
      if (bVar1) {
        in_stack_fffffffffffffb50 = get_reg();
        in_stack_fffffffffffffb48 =
             ggml_backend_registry::load_backend
                       (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                        (bool)in_stack_fffffffffffffc6f);
        local_8 = in_stack_fffffffffffffb48;
      }
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
      if (bVar1) goto LAB_00113496;
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::operator++(&local_370);
    }
    local_8 = (ggml_backend_reg_t)0x0;
  }
  else {
    in_stack_fffffffffffffb40 = get_reg();
    local_8 = ggml_backend_registry::load_backend
                        (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                         (bool)in_stack_fffffffffffffc6f);
  }
LAB_00113496:
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )in_stack_fffffffffffffb50);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb40);
  return local_8;
}

Assistant:

static ggml_backend_reg_t ggml_backend_load_best(const char * name, bool silent, const char * user_search_path) {
    // enumerate all the files that match [lib]ggml-name-*.[so|dll] in the search paths
    const fs::path name_path = fs::u8path(name);
    const fs::path file_prefix = backend_filename_prefix().native() + name_path.native() + fs::u8path("-").native();
    const fs::path file_extension = backend_filename_extension();

    std::vector<fs::path> search_paths;
    if (user_search_path == nullptr) {
        // default search paths: executable directory, current directory
        search_paths.push_back(get_executable_path());
        search_paths.push_back(fs::current_path());
    } else {
        search_paths.push_back(fs::u8path(user_search_path));
    }

    int best_score = 0;
    fs::path best_path;

    for (const auto & search_path : search_paths) {
        if (!fs::exists(search_path)) {
            GGML_LOG_DEBUG("%s: search path %s does not exist\n", __func__, path_str(search_path).c_str());
            continue;
        }
        fs::directory_iterator dir_it(search_path, fs::directory_options::skip_permission_denied);
        for (const auto & entry : dir_it) {
            if (entry.is_regular_file()) {
                auto filename = entry.path().filename();
                auto ext = entry.path().extension();
                if (filename.native().find(file_prefix) == 0 && ext == file_extension) {
                    dl_handle_ptr handle { dl_load_library(entry) };
                    if (!handle && !silent) {
                        GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(entry.path()).c_str());
                    }
                    if (handle) {
                        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
                        if (score_fn) {
                            int s = score_fn();
#ifndef NDEBUG
                            GGML_LOG_DEBUG("%s: %s score: %d\n", __func__, path_str(entry.path()).c_str(), s);
#endif
                            if (s > best_score) {
                                best_score = s;
                                best_path = entry.path();
                            }
                        } else {
                            if (!silent) {
                                GGML_LOG_INFO("%s: failed to find ggml_backend_score in %s\n", __func__, path_str(entry.path()).c_str());
                            }
                        }
                    }
                }
            }
        }
    }

    if (best_score == 0) {
        // try to load the base backend
        for (const auto & search_path : search_paths) {
            fs::path filename = backend_filename_prefix().native() + name_path.native() + backend_filename_extension().native();
            fs::path path = search_path / filename;
            if (fs::exists(path)) {
                return get_reg().load_backend(path, silent);
            }
        }
        return nullptr;
    }

    return get_reg().load_backend(best_path, silent);
}